

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O3

void GEO::expansion::delete_expansion_on_heap(expansion *e)

{
  undefined8 uVar1;
  char cVar2;
  ulong uVar3;
  
  do {
    cVar2 = expansions_lock;
    LOCK();
    expansions_lock = '\x01';
    UNLOCK();
  } while (cVar2 == '\x01');
  uVar3 = (ulong)(e->capacity_ + 1);
  if (uVar3 * 8 + 8 < (ulong)(DAT_001abcf0 - ::(anonymous_namespace)::pools_ >> 3)) {
    uVar1 = *(undefined8 *)(::(anonymous_namespace)::pools_ + 0x40 + uVar3 * 0x40);
    e->length_ = (int)uVar1;
    e->capacity_ = (int)((ulong)uVar1 >> 0x20);
    *(expansion **)(::(anonymous_namespace)::pools_ + 0x40 + uVar3 * 0x40) = e;
  }
  else {
    free(e);
  }
  expansions_lock = 0;
  return;
}

Assistant:

void expansion::delete_expansion_on_heap(expansion* e) {
	Process::acquire_spinlock(expansions_lock);	
        pools_.free(e, expansion::bytes(e->capacity()));
	Process::release_spinlock(expansions_lock);	
    }